

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_read_xtension(fitsfile *ff,int parent_hn,int simple_mode)

{
  int iVar1;
  size_t sVar2;
  uint in_EDX;
  int in_ESI;
  fitsfile *in_RDI;
  long lv;
  NGP_HDU ngph;
  long ngph_size [999];
  char *ngph_extname;
  char ngph_ctmp;
  char incrementor_name [80];
  int my_version;
  int ngph_node_type;
  int ngph_bitpix;
  int ngph_dim;
  int j;
  int i;
  int incrementor_index;
  int tmp0;
  int my_hn;
  int l;
  int exflg;
  int r;
  NGP_HDU *in_stack_ffffffffffffdfd8;
  NGP_TOKEN *in_stack_ffffffffffffdfe0;
  NGP_HDU *in_stack_ffffffffffffdfe8;
  int in_stack_ffffffffffffdff0;
  int in_stack_ffffffffffffdff4;
  int in_stack_ffffffffffffdff8;
  int iVar3;
  NGP_HDU *in_stack_ffffffffffffe000;
  int in_stack_ffffffffffffe008;
  undefined4 in_stack_ffffffffffffe00c;
  NGP_TOKEN *in_stack_ffffffffffffe010;
  undefined4 in_stack_ffffffffffffe018;
  int in_stack_ffffffffffffe01c;
  int *in_stack_ffffffffffffe020;
  undefined4 in_stack_ffffffffffffe028;
  int in_stack_ffffffffffffe02c;
  fitsfile *in_stack_ffffffffffffe030;
  fitsfile *in_stack_ffffffffffffe038;
  int *in_stack_ffffffffffffe040;
  int *in_stack_ffffffffffffe048;
  undefined4 in_stack_ffffffffffffe050;
  int in_stack_ffffffffffffe054;
  fitsfile *in_stack_ffffffffffffe058;
  int *in_stack_ffffffffffffe060;
  int in_stack_ffffffffffffe0bc;
  fitsfile *in_stack_ffffffffffffe0c0;
  NGP_HDU *in_stack_ffffffffffffe0c8;
  char *local_a8;
  undefined1 local_99;
  char local_98 [84];
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  uint local_30;
  undefined4 local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  uint local_18;
  int local_14;
  fitsfile *local_10;
  int local_4;
  
  local_a8 = (char *)0x0;
  local_98[0] = '\0';
  local_30 = 0;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_1c = ngp_hdu_init((NGP_HDU *)&stack0xffffffffffffe008);
  local_4 = local_1c;
  if ((local_1c == 0) &&
     (local_1c = ngp_read_line(in_stack_ffffffffffffdff0), local_4 = local_1c, local_1c == 0)) {
    if ((local_18 & 1) == 0) {
      if (ngp_keyidx != 3) {
        return 0x171;
      }
    }
    else if (ngp_keyidx != 4) {
      return 0x171;
    }
    local_4 = ngp_hdu_insert_token(in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0);
    if (local_4 == 0) {
      local_1c = 0;
      do {
        local_1c = ngp_read_line(in_stack_ffffffffffffdff0);
        if (local_1c != 0) {
          return local_1c;
        }
        local_20 = 0;
        iVar3 = ngp_keyidx;
        if (ngp_keyidx - 1U < 3) {
          iVar1 = ngp_unread_line();
LAB_001dc04a:
          local_1c = iVar1;
          local_20 = 1;
        }
        else if (ngp_keyidx == 4) {
          local_1c = 0x171;
        }
        else {
          iVar1 = 0;
          if (ngp_keyidx == 5) goto LAB_001dc04a;
          sVar2 = strlen(ngp_linkey.name);
          local_24 = (int)sVar2;
          if (((1 < local_24) && (local_24 < 7)) && (ngp_linkey.name[local_24 + -1] == '#')) {
            if (local_98[0] == '\0') {
              memcpy(local_98,ngp_linkey.name,(long)(local_24 + -1));
              local_98[local_24 + -1] = '\0';
            }
            in_stack_ffffffffffffdff8 = local_24 + -1;
            sVar2 = strlen(local_98);
            if ((in_stack_ffffffffffffdff8 == (int)sVar2) &&
               (iVar1 = memcmp(local_98,ngp_linkey.name,(long)(local_24 + -1)), iVar1 == 0)) {
              local_30 = local_30 + 1;
            }
            snprintf(ngp_linkey.name + (long)local_24 + -1,(long)(0x4c - local_24),"%d",
                     (ulong)local_30);
          }
          local_1c = ngp_hdu_insert_token(in_stack_ffffffffffffdfe8,in_stack_ffffffffffffdfe0);
        }
      } while ((local_1c == 0) && (local_20 == 0));
      if (local_1c == 0) {
        local_44 = 0;
        local_40 = 0;
        local_a8 = (char *)0x0;
        for (local_34 = 0; local_34 < 999; local_34 = local_34 + 1) {
          *(undefined8 *)(&stack0xffffffffffffe018 + (long)local_34 * 8) = 0;
        }
        local_3c = 0;
        for (local_34 = 0; local_34 < in_stack_ffffffffffffe008; local_34 = local_34 + 1) {
          iVar1 = strcmp("XTENSION",in_stack_ffffffffffffe010[local_34].name);
          if (iVar1 == 0) {
            if (in_stack_ffffffffffffe010[local_34].type == 2) {
              iVar1 = fits_strncasecmp((char *)in_stack_ffffffffffffdfe8,
                                       (char *)in_stack_ffffffffffffdfe0,
                                       (size_t)in_stack_ffffffffffffdfd8);
              if (iVar1 == 0) {
                local_44 = 3;
              }
              iVar1 = fits_strncasecmp((char *)in_stack_ffffffffffffdfe8,
                                       (char *)in_stack_ffffffffffffdfe0,
                                       (size_t)in_stack_ffffffffffffdfd8);
              if (iVar1 == 0) {
                local_44 = 2;
              }
              iVar1 = fits_strncasecmp((char *)in_stack_ffffffffffffdfe8,
                                       (char *)in_stack_ffffffffffffdfe0,
                                       (size_t)in_stack_ffffffffffffdfd8);
              if (iVar1 == 0) {
                local_44 = 1;
              }
            }
          }
          else {
            iVar1 = strcmp("SIMPLE",in_stack_ffffffffffffe010[local_34].name);
            if (iVar1 == 0) {
              if ((in_stack_ffffffffffffe010[local_34].type == 1) &&
                 (in_stack_ffffffffffffe010[local_34].value.b != '\0')) {
                local_44 = 1;
              }
            }
            else {
              iVar1 = strcmp("BITPIX",in_stack_ffffffffffffe010[local_34].name);
              if (iVar1 == 0) {
                if (in_stack_ffffffffffffe010[local_34].type == 3) {
                  local_40 = in_stack_ffffffffffffe010[local_34].value.i;
                }
              }
              else {
                iVar1 = strcmp("NAXIS",in_stack_ffffffffffffe010[local_34].name);
                if (iVar1 == 0) {
                  if (in_stack_ffffffffffffe010[local_34].type == 3) {
                    local_3c = in_stack_ffffffffffffe010[local_34].value.i;
                  }
                }
                else {
                  iVar1 = strcmp("EXTNAME",in_stack_ffffffffffffe010[local_34].name);
                  if (iVar1 == 0) {
                    if (in_stack_ffffffffffffe010[local_34].type == 2) {
                      local_a8 = in_stack_ffffffffffffe010[local_34].value.s;
                    }
                  }
                  else {
                    iVar1 = __isoc99_sscanf(in_stack_ffffffffffffe010[local_34].name,"NAXIS%d%c",
                                            &local_38,&local_99);
                    if ((((iVar1 == 1) && (in_stack_ffffffffffffe010[local_34].type == 3)) &&
                        (0 < local_38)) && (local_38 < 1000)) {
                      *(long *)(&stack0xffffffffffffe018 + (long)(local_38 + -1) * 8) =
                           (long)in_stack_ffffffffffffe010[local_34].value.i;
                    }
                  }
                }
              }
            }
          }
        }
        in_stack_ffffffffffffdff4 = local_44;
        if (local_44 == 1) {
          if ((local_18 & 3) == 2) {
            ffcrim((fitsfile *)CONCAT44(in_stack_ffffffffffffe00c,in_stack_ffffffffffffe008),
                   (int)((ulong)in_stack_ffffffffffffe000 >> 0x20),(int)in_stack_ffffffffffffe000,
                   (long *)CONCAT44(iVar3,in_stack_ffffffffffffdff8),
                   (int *)CONCAT44(1,in_stack_ffffffffffffdff0));
          }
          ffcrim((fitsfile *)CONCAT44(in_stack_ffffffffffffe00c,in_stack_ffffffffffffe008),
                 (int)((ulong)in_stack_ffffffffffffe000 >> 0x20),(int)in_stack_ffffffffffffe000,
                 (long *)CONCAT44(iVar3,in_stack_ffffffffffffdff8),
                 (int *)CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0));
          if (local_1c == 0) {
            local_1c = ngp_keyword_all_write
                                 (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,
                                  in_stack_ffffffffffffe0bc);
          }
        }
        else if (local_44 - 2U < 2) {
          in_stack_ffffffffffffdfd8 = (NGP_HDU *)0x0;
          ffcrtb(in_stack_ffffffffffffe030,in_stack_ffffffffffffe02c,
                 (LONGLONG)in_stack_ffffffffffffe020,in_stack_ffffffffffffe01c,
                 (char **)in_stack_ffffffffffffe010,
                 (char **)CONCAT44(in_stack_ffffffffffffe00c,in_stack_ffffffffffffe008),
                 (char **)CONCAT44(in_stack_ffffffffffffe054,in_stack_ffffffffffffe050),
                 (char *)in_stack_ffffffffffffe058,in_stack_ffffffffffffe060);
          if (((local_1c == 0) &&
              (local_1c = ngp_append_columns((fitsfile *)
                                             CONCAT44(in_stack_ffffffffffffe00c,
                                                      in_stack_ffffffffffffe008),
                                             in_stack_ffffffffffffe000,iVar3), local_1c == 0)) &&
             ((local_1c = ngp_keyword_all_write
                                    (in_stack_ffffffffffffe0c8,in_stack_ffffffffffffe0c0,
                                     in_stack_ffffffffffffe0bc), local_1c == 0 &&
              (0 < (long)in_stack_ffffffffffffe020)))) {
            ffirow(in_stack_ffffffffffffe038,(LONGLONG)in_stack_ffffffffffffe030,
                   CONCAT44(in_stack_ffffffffffffe02c,in_stack_ffffffffffffe028),
                   in_stack_ffffffffffffe020);
          }
        }
        else {
          local_1c = 0x170;
        }
      }
      if ((local_1c == 0) && (local_a8 != (char *)0x0)) {
        local_1c = ngp_get_extver((char *)CONCAT44(iVar3,in_stack_ffffffffffffdff8),
                                  (int *)CONCAT44(in_stack_ffffffffffffdff4,
                                                  in_stack_ffffffffffffdff0));
        ffpky(in_stack_ffffffffffffe058,in_stack_ffffffffffffe054,(char *)in_stack_ffffffffffffe048,
              in_stack_ffffffffffffe040,(char *)in_stack_ffffffffffffe038,
              &in_stack_ffffffffffffe030->HDUposition);
      }
      if ((local_1c == 0) && (0 < local_14)) {
        ffghdn(local_10,&local_28);
        ffmahd(in_stack_ffffffffffffe058,in_stack_ffffffffffffe054,in_stack_ffffffffffffe048,
               in_stack_ffffffffffffe040);
        ffgtam((fitsfile *)ngph_size[0xfb],(fitsfile *)ngph_size[0xfa],ngph_size[0xf9]._4_4_,
               (int *)ngph_size[0xf8]);
        ffmahd(in_stack_ffffffffffffe058,in_stack_ffffffffffffe054,in_stack_ffffffffffffe048,
               in_stack_ffffffffffffe040);
        if (local_1c != 0) {
          return local_1c;
        }
      }
      if (local_1c != 0) {
        local_2c = 0;
        ffdhdu((fitsfile *)CONCAT44(in_stack_ffffffffffffe01c,in_stack_ffffffffffffe018),
               &in_stack_ffffffffffffe010->type,
               (int *)CONCAT44(in_stack_ffffffffffffe00c,in_stack_ffffffffffffe008));
      }
      ngp_hdu_clear(in_stack_ffffffffffffdfd8);
      local_4 = local_1c;
    }
  }
  return local_4;
}

Assistant:

int	ngp_read_xtension(fitsfile *ff, int parent_hn, int simple_mode)
 { int		r, exflg, l, my_hn, tmp0, incrementor_index, i, j;
   int		ngph_dim, ngph_bitpix, ngph_node_type, my_version;
   char		incrementor_name[NGP_MAX_STRING], ngph_ctmp;
   char 	*ngph_extname = 0;
   long		ngph_size[NGP_MAX_ARRAY_DIM];
   NGP_HDU	ngph;
   long		lv;

   incrementor_name[0] = 0;			/* signal no keyword+'#' found yet */
   incrementor_index = 0;

   if (NGP_OK != (r = ngp_hdu_init(&ngph))) return(r);

   if (NGP_OK != (r = ngp_read_line(0))) return(r);	/* EOF always means error here */
   switch (NGP_XTENSION_SIMPLE & simple_mode)
     {
       case 0:  if (NGP_TOKEN_XTENSION != ngp_keyidx) return(NGP_TOKEN_NOT_EXPECT);
		break;
       default:	if (NGP_TOKEN_SIMPLE != ngp_keyidx) return(NGP_TOKEN_NOT_EXPECT);
		break;
     }
       	
   if (NGP_OK != (r = ngp_hdu_insert_token(&ngph, &ngp_linkey))) return(r);

   for (;;)
    { if (NGP_OK != (r = ngp_read_line(0))) return(r);	/* EOF always means error here */
      exflg = 0;
      switch (ngp_keyidx)
       { 
	 case NGP_TOKEN_SIMPLE:
	 		r = NGP_TOKEN_NOT_EXPECT;
			break;
	 		                        
	 case NGP_TOKEN_END:
         case NGP_TOKEN_XTENSION:
         case NGP_TOKEN_GROUP:
         		r = ngp_unread_line();	/* WARNING - not break here .... */
         case NGP_TOKEN_EOF:
			exflg = 1;
 			break;

         default:	l = strlen(ngp_linkey.name);
			if ((l >= 2) && (l <= 6))
			  { if ('#' == ngp_linkey.name[l - 1])
			      { if (0 == incrementor_name[0])
			          { memcpy(incrementor_name, ngp_linkey.name, l - 1);
			            incrementor_name[l - 1] = 0;
			          }
			        if (((l - 1) == (int)strlen(incrementor_name)) && (0 == memcmp(incrementor_name, ngp_linkey.name, l - 1)))
			          { incrementor_index++;
			          }
			        snprintf(ngp_linkey.name + l - 1, NGP_MAX_NAME-l+1,"%d", incrementor_index);
			      }
			  }
			r = ngp_hdu_insert_token(&ngph, &ngp_linkey);
 			break;
       }
      if ((NGP_OK != r) || exflg) break;
    }

   if (NGP_OK == r)
     { 				/* we should scan keywords, and calculate HDU's */
				/* structure ourselves .... */

       ngph_node_type = NGP_NODE_INVALID;	/* init variables */
       ngph_bitpix = 0;
       ngph_extname = NULL;
       for (i=0; i<NGP_MAX_ARRAY_DIM; i++) ngph_size[i] = 0;
       ngph_dim = 0;

       for (i=0; i<ngph.tokcnt; i++)
        { if (!strcmp("XTENSION", ngph.tok[i].name))
            { if (NGP_TTYPE_STRING == ngph.tok[i].type)
                { if (!fits_strncasecmp("BINTABLE", ngph.tok[i].value.s,8)) ngph_node_type = NGP_NODE_BTABLE;
                  if (!fits_strncasecmp("TABLE", ngph.tok[i].value.s,5)) ngph_node_type = NGP_NODE_ATABLE;
                  if (!fits_strncasecmp("IMAGE", ngph.tok[i].value.s,5)) ngph_node_type = NGP_NODE_IMAGE;
                }
            }
          else if (!strcmp("SIMPLE", ngph.tok[i].name))
            { if (NGP_TTYPE_BOOL == ngph.tok[i].type)
                { if (ngph.tok[i].value.b) ngph_node_type = NGP_NODE_IMAGE;
                }
            }
          else if (!strcmp("BITPIX", ngph.tok[i].name))
            { if (NGP_TTYPE_INT == ngph.tok[i].type)  ngph_bitpix = ngph.tok[i].value.i;
            }
          else if (!strcmp("NAXIS", ngph.tok[i].name))
            { if (NGP_TTYPE_INT == ngph.tok[i].type)  ngph_dim = ngph.tok[i].value.i;
            }
          else if (!strcmp("EXTNAME", ngph.tok[i].name))	/* assign EXTNAME, I hope struct does not move */
            { if (NGP_TTYPE_STRING == ngph.tok[i].type)  ngph_extname = ngph.tok[i].value.s;
            }
          else if (1 == sscanf(ngph.tok[i].name, "NAXIS%d%c", &j, &ngph_ctmp))
            { if (NGP_TTYPE_INT == ngph.tok[i].type)
		if ((j>=1) && (j <= NGP_MAX_ARRAY_DIM))
		  { ngph_size[j - 1] = ngph.tok[i].value.i;
		  }
            }
        }

       switch (ngph_node_type)
        { case NGP_NODE_IMAGE:
			if (NGP_XTENSION_FIRST == ((NGP_XTENSION_FIRST | NGP_XTENSION_SIMPLE) & simple_mode))
			  { 		/* if caller signals that this is 1st HDU in file */
					/* and it is IMAGE defined with XTENSION, then we */
					/* need create dummy Primary HDU */			  
			    fits_create_img(ff, 16, 0, NULL, &r);
			  }
					/* create image */
			fits_create_img(ff, ngph_bitpix, ngph_dim, ngph_size, &r);

					/* update keywords */
			if (NGP_OK == r)  r = ngp_keyword_all_write(&ngph, ff, NGP_NON_SYSTEM_ONLY);
			break;

          case NGP_NODE_ATABLE:
          case NGP_NODE_BTABLE:
					/* create table, 0 rows and 0 columns for the moment */
			fits_create_tbl(ff, ((NGP_NODE_ATABLE == ngph_node_type)
					     ? ASCII_TBL : BINARY_TBL),
					0, 0, NULL, NULL, NULL, NULL, &r);
			if (NGP_OK != r) break;

					/* add columns ... */
			r = ngp_append_columns(ff, &ngph, 0);
			if (NGP_OK != r) break;

					/* add remaining keywords */
			r = ngp_keyword_all_write(&ngph, ff, NGP_NON_SYSTEM_ONLY);
			if (NGP_OK != r) break;

					/* if requested add rows */
			if (ngph_size[1] > 0) fits_insert_rows(ff, 0, ngph_size[1], &r);
			break;

	  default:	r = NGP_BAD_ARG;
	  		break;
	}

     }

   if ((NGP_OK == r) && (NULL != ngph_extname))
     { r = ngp_get_extver(ngph_extname, &my_version);	/* write correct ext version number */
       lv = my_version;		/* bugfix - 22-Jan-99, BO - nonalignment of OSF/Alpha */
       fits_write_key(ff, TLONG, "EXTVER", &lv, "auto assigned by template parser", &r); 
     }

   if (NGP_OK == r)
     { if (parent_hn > 0)
         { fits_get_hdu_num(ff, &my_hn);
           fits_movabs_hdu(ff, parent_hn, &tmp0, &r);	/* link us to parent */
           fits_add_group_member(ff, NULL, my_hn, &r);
           fits_movabs_hdu(ff, my_hn, &tmp0, &r);
           if (NGP_OK != r) return(r);
         }
     }

   if (NGP_OK != r)					/* in case of error - delete hdu */
     { tmp0 = 0;
       fits_delete_hdu(ff, NULL, &tmp0);
     }

   ngp_hdu_clear(&ngph);
   return(r);
 }